

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O1

MatchResult __thiscall
r_exec::PGMOverlay::_match(PGMOverlay *this,View *input,uint16_t pattern_index)

{
  Code *pCVar1;
  _Object *p_Var2;
  Atom *pAVar3;
  View *pVVar4;
  bool bVar5;
  short sVar6;
  ushort uVar7;
  uint16_t uVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  uint16_t result_index;
  IPGMContext input_object;
  IPGMContext c_1;
  IPGMContext pattern_skeleton;
  IPGMContext c;
  uint16_t local_f2;
  IPGMContext local_f0;
  IPGMContext local_c0;
  IPGMContext local_90;
  IPGMContext local_60;
  
  sVar6 = r_code::Atom::asOpcode();
  local_f0.super__Context.overlay = (Overlay *)this;
  local_f0.view = input;
  local_90.super__Context.overlay = (Overlay *)this;
  local_60.super__Context.overlay = (Overlay *)this;
  if (sVar6 == Opcodes::AntiPtn) {
    pCVar1 = (Code *)(input->super_View).object.object;
    iVar9 = (*(pCVar1->super__Object)._vptr__Object[4])(pCVar1,0);
    local_f0.super__Context.code = (Atom *)CONCAT44(extraout_var,iVar9);
    local_f0.super__Context.index = 0;
    local_f0.super__Context.data = REFERENCE;
    local_f0.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
    p_Var2 = (((this->super_InputLessPGMOverlay).super_Overlay.controller)->view->object).object;
    local_f0.object = pCVar1;
    iVar9 = (*p_Var2->_vptr__Object[9])(p_Var2,0);
    pAVar3 = (this->super_InputLessPGMOverlay).super_Overlay.code;
    pVVar4 = (View *)((this->super_InputLessPGMOverlay).super_Overlay.controller)->view;
    local_90.super__Context.index = r_code::Atom::asIndex();
    local_90.super__Context.data = STEM;
    local_90.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
    local_90.super__Context.code = pAVar3;
    local_90.object = (Code *)CONCAT44(extraout_var_00,iVar9);
    local_90.view = pVVar4;
    bVar5 = IPGMContext::match(&local_90,&local_f0);
    if (!bVar5) {
      return SUCCESS;
    }
    uVar7 = r_code::Atom::asIndex();
    (*(this->super_InputLessPGMOverlay).super_Overlay.super__Object._vptr__Object[6])
              (this,(ulong)uVar7,
               (ulong)(((uint)(*(int *)&(this->input_views).
                                        super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                              *(int *)&(this->input_views).
                                       super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1 & 0xffff
                      ),0,0xffffffff);
    uVar8 = r_code::Atom::asIndex();
    p_Var2 = (((this->super_InputLessPGMOverlay).super_Overlay.controller)->view->object).object;
    iVar9 = (*p_Var2->_vptr__Object[9])(p_Var2,0);
    local_60.object = (Code *)CONCAT44(extraout_var_01,iVar9);
    local_60.super__Context.code = (this->super_InputLessPGMOverlay).super_Overlay.code;
    local_60.view = (View *)((this->super_InputLessPGMOverlay).super_Overlay.controller)->view;
    local_60.super__Context.data = STEM;
    local_60.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
    local_60.super__Context.index = uVar8;
    IPGMContext::operator*(&local_c0,&local_60);
    bVar5 = IPGMContext::evaluate_no_dereference(&local_c0,&local_f2);
  }
  else {
    sVar6 = r_code::Atom::asOpcode();
    if (sVar6 != Opcodes::Ptn) {
      return IMPOSSIBLE;
    }
    pCVar1 = (Code *)(input->super_View).object.object;
    iVar9 = (*(pCVar1->super__Object)._vptr__Object[4])(pCVar1,0);
    local_f0.super__Context.code = (Atom *)CONCAT44(extraout_var_02,iVar9);
    local_f0.super__Context.index = 0;
    local_f0.super__Context.data = REFERENCE;
    local_f0.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
    p_Var2 = (((this->super_InputLessPGMOverlay).super_Overlay.controller)->view->object).object;
    local_f0.object = pCVar1;
    iVar9 = (*p_Var2->_vptr__Object[9])(p_Var2,0);
    pAVar3 = (this->super_InputLessPGMOverlay).super_Overlay.code;
    pVVar4 = (View *)((this->super_InputLessPGMOverlay).super_Overlay.controller)->view;
    local_90.super__Context.index = r_code::Atom::asIndex();
    local_90.super__Context.data = STEM;
    local_90.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
    local_90.super__Context.code = pAVar3;
    local_90.object = (Code *)CONCAT44(extraout_var_03,iVar9);
    local_90.view = pVVar4;
    bVar5 = IPGMContext::match(&local_90,&local_f0);
    if (!bVar5) {
      return IMPOSSIBLE;
    }
    uVar7 = r_code::Atom::asIndex();
    (*(this->super_InputLessPGMOverlay).super_Overlay.super__Object._vptr__Object[6])
              (this,(ulong)uVar7,
               (ulong)(((uint)(*(int *)&(this->input_views).
                                        super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                              *(int *)&(this->input_views).
                                       super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1 & 0xffff
                      ),0,0xffffffff);
    uVar8 = r_code::Atom::asIndex();
    p_Var2 = (((this->super_InputLessPGMOverlay).super_Overlay.controller)->view->object).object;
    iVar9 = (*p_Var2->_vptr__Object[9])(p_Var2,0);
    local_60.object = (Code *)CONCAT44(extraout_var_04,iVar9);
    local_60.super__Context.code = (this->super_InputLessPGMOverlay).super_Overlay.code;
    local_60.view = (View *)((this->super_InputLessPGMOverlay).super_Overlay.controller)->view;
    local_60.super__Context.data = STEM;
    local_60.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
    local_60.super__Context.index = uVar8;
    IPGMContext::operator*(&local_c0,&local_60);
    bVar5 = IPGMContext::evaluate_no_dereference(&local_c0,&local_f2);
    bVar5 = !bVar5;
  }
  return (uint)bVar5;
}

Assistant:

inline PGMOverlay::MatchResult PGMOverlay::_match(r_exec::View *input, uint16_t pattern_index)
{
    if (code[pattern_index].asOpcode() == Opcodes::AntiPtn) {
        IPGMContext input_object = IPGMContext::GetContextFromInput(input, this);
        IPGMContext pattern_skeleton(getObject()->get_reference(0), getView(), code, code[pattern_index + 1].asIndex(), this); // pgm_code[pattern_index] is the first atom of the pattern; pgm_code[pattern_index+1] is an iptr to the skeleton.

        if (!pattern_skeleton.match(input_object)) {
            return SUCCESS;
        }

        MatchResult r = __match(input, pattern_index);

        switch (r) {
        case IMPOSSIBLE:
        case FAILURE:
            return SUCCESS;

        case SUCCESS:
            return FAILURE;
        }
    } else if (code[pattern_index].asOpcode() == Opcodes::Ptn) {
        IPGMContext input_object = IPGMContext::GetContextFromInput(input, this);
        IPGMContext pattern_skeleton(getObject()->get_reference(0), getView(), code, code[pattern_index + 1].asIndex(), this); // pgm_code[pattern_index] is the first atom of the pattern; pgm_code[pattern_index+1] is an iptr to the skeleton.

        if (!pattern_skeleton.match(input_object)) {
            return IMPOSSIBLE;
        }

        return __match(input, pattern_index);
    }

    return IMPOSSIBLE;
}